

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3lamb_io.c
# Opt level: O0

int s3lamb_write(char *fn,float32 *lambda,uint32 n_lambda)

{
  int iVar1;
  int32 iVar2;
  uint32 local_38 [2];
  uint32 ignore;
  uint32 chksum;
  FILE *fp;
  float32 *pfStack_20;
  uint32 n_lambda_local;
  float32 *lambda_local;
  char *fn_local;
  
  local_38[1] = 0;
  local_38[0] = 0;
  fp._4_4_ = n_lambda;
  pfStack_20 = lambda;
  lambda_local = (float32 *)fn;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  _ignore = s3open((char *)lambda_local,"wb",(uint32 *)0x0);
  if (_ignore == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    iVar1 = bio_fwrite_1d(pfStack_20,4,fp._4_4_,_ignore,local_38 + 1);
    if (iVar1 == 0) {
      iVar2 = bio_fwrite(local_38 + 1,4,1,_ignore,0,local_38);
      if (iVar2 == 1) {
        s3close(_ignore);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
                ,0x95,"Wrote %s [%u array]\n",lambda_local,(ulong)fp._4_4_);
        fn_local._4_4_ = 0;
      }
      else {
        s3close(_ignore);
        fn_local._4_4_ = -1;
      }
    }
    else {
      s3close(_ignore);
      fn_local._4_4_ = -1;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3lamb_write(const char *fn,
	     const float32 *lambda,
	     uint32 n_lambda)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", LAMBDA_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);


    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite_1d((void *)lambda, sizeof(float32), n_lambda, fp, &chksum) != S3_SUCCESS) {
	s3close(fp);
	return S3_ERROR;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    s3close(fp);

    E_INFO("Wrote %s [%u array]\n", fn, n_lambda);

    return S3_SUCCESS;
}